

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalGenerator::GenerateCMakeBuildCommand
          (string *__return_storage_ptr__,cmGlobalGenerator *this,string *target,string *config,
          string *parallel,string *native,bool ignoreErrors)

{
  int iVar1;
  string *psVar2;
  ulong uVar3;
  undefined4 extraout_var;
  char *iflag;
  char *sep;
  string local_b0;
  cmAlphaNum local_90;
  string local_60;
  undefined1 local_3a;
  byte local_39;
  string *psStack_38;
  bool ignoreErrors_local;
  string *native_local;
  string *parallel_local;
  string *config_local;
  string *target_local;
  cmGlobalGenerator *this_local;
  string *makeCommand;
  char *pcVar4;
  
  local_39 = ignoreErrors;
  local_3a = 0;
  psStack_38 = native;
  native_local = parallel;
  parallel_local = config;
  config_local = target;
  target_local = (string *)this;
  this_local = (cmGlobalGenerator *)__return_storage_ptr__;
  psVar2 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  cmSystemTools::ConvertToOutputPath(&local_b0,__return_storage_ptr__);
  cmAlphaNum::cmAlphaNum(&local_90,&local_b0);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&sep," --build .");
  cmStrCat<>(&local_60,&local_90,(cmAlphaNum *)&sep);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_b0);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," --config \"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)parallel_local);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," --parallel \"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)native_local);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," --target \"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)config_local);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
  }
  iflag = " -- ";
  if ((local_39 & 1) != 0) {
    iVar1 = (*this->_vptr_cmGlobalGenerator[0x3f])();
    pcVar4 = (char *)CONCAT44(extraout_var,iVar1);
    if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," -- ");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar4);
      iflag = " ";
    }
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,iflag);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::GenerateCMakeBuildCommand(
  const std::string& target, const std::string& config,
  const std::string& parallel, const std::string& native, bool ignoreErrors)
{
  std::string makeCommand = cmSystemTools::GetCMakeCommand();
  makeCommand =
    cmStrCat(cmSystemTools::ConvertToOutputPath(makeCommand), " --build .");
  if (!config.empty()) {
    makeCommand += " --config \"";
    makeCommand += config;
    makeCommand += "\"";
  }
  if (!parallel.empty()) {
    makeCommand += " --parallel \"";
    makeCommand += parallel;
    makeCommand += "\"";
  }
  if (!target.empty()) {
    makeCommand += " --target \"";
    makeCommand += target;
    makeCommand += "\"";
  }
  const char* sep = " -- ";
  if (ignoreErrors) {
    const char* iflag = this->GetBuildIgnoreErrorsFlag();
    if (iflag && *iflag) {
      makeCommand += sep;
      makeCommand += iflag;
      sep = " ";
    }
  }
  if (!native.empty()) {
    makeCommand += sep;
    makeCommand += native;
  }
  return makeCommand;
}